

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.h
# Opt level: O1

bool __thiscall
Clasp::Asp::LogicProgram::checkBody
          (LogicProgram *this,PrgBody *rhs,Body_t type,uint32 size,weight_t bound)

{
  uint uVar1;
  Id_t IVar2;
  uint uVar3;
  PrgNode PVar4;
  
  PVar4 = rhs->super_PrgNode;
  if ((((((ulong)PVar4 >> 0x3e & 1) == 0) ||
       (((~(ulong)PVar4 & 0xfffffff00000000) != 0 &&
        (IVar2 = getEqNode<bk_lib::pod_vector<Clasp::Asp::PrgBody*,std::allocator<Clasp::Asp::PrgBody*>>const>
                           (this,&this->bodies_,PVar4._4_4_ & 0xfffffff),
        ((ulong)(this->bodies_).ebo_.buf[IVar2]->super_PrgNode & 0x4000000000000000) == 0)))) &&
      (uVar1 = *(uint *)&rhs->field_0x8, (uVar1 >> 0x1b & __eEnd) == type.val_)) &&
     (uVar3 = uVar1 & 0x1ffffff, uVar3 == size)) {
    if ((uVar1 & 0x18000000) != 0) {
      if ((uVar1 & 0x18000000) == 0x8000000) {
        PVar4 = rhs[1].super_PrgNode;
      }
      else {
        PVar4 = (PrgNode)(rhs + 1);
      }
      uVar3 = *(uint *)PVar4;
    }
    return uVar3 == bound;
  }
  return false;
}

Assistant:

bool checkBody(const PrgBody& rhs, Body_t type, uint32 size, weight_t bound) const {
		return (rhs.relevant() || (rhs.eq() && getBody(getEqBody(rhs.id()))->relevant()))
			&& rhs.type() == type && rhs.size() == size && rhs.bound() == bound;
	}